

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

node_t unop(int id,node_t right)

{
  _node_t *child;
  _node_t *in_RSI;
  int in_EDI;
  _node_t *new;
  
  child = create_node();
  if (in_EDI == 0x2b) {
    child->id = 0x8d;
  }
  else if (in_EDI == 0x2d) {
    child->id = 0x8c;
  }
  else {
    child->id = in_EDI;
  }
  child->type = UNOP;
  add_child(in_RSI,child);
  return child;
}

Assistant:

node_t unop(int id, node_t right)
{
    _node_t* new = create_node();
    if (id == '+')
        new->id = POSITIVE;
    else if (id == '-')
        new->id = NEGATIVE;
    else
        new->id = id;
    new->type = UNOP;
    add_child(new, (_node_t*)right);
    return (node_t)new;
}